

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O3

bool __thiscall
dtc::fdt::checking::property_checker::check_property
          (property_checker *this,device_tree *tree,node_ptr *n,property_ptr *p)

{
  element_type *peVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar1 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __n = (peVar1->key)._M_string_length;
  bVar3 = true;
  if (__n == (this->key)._M_string_length) {
    if ((__n != 0) &&
       (iVar2 = bcmp((peVar1->key)._M_dataplus._M_p,(this->key)._M_dataplus._M_p,__n), iVar2 != 0))
    {
      return true;
    }
    local_38 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
    local_40 = peVar1;
    iVar2 = (*(this->super_checker)._vptr_checker[4])(this,tree,n,&local_40);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((char)iVar2 == '\0') {
      checker::report_error(&this->super_checker,"property check failed");
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool
property_checker::check_property(device_tree *tree, const node_ptr &n, property_ptr p)
{
	if (p->get_key() == key)
	{
		if (!check(tree, n, p))
		{
			report_error("property check failed");
			return false;
		}
	}
	return true;
}